

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mips.cpp
# Opt level: O3

unique_ptr<IElfRelocator,_std::default_delete<IElfRelocator>_> __thiscall
CMipsArchitecture::getElfRelocator(CMipsArchitecture *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  
  if (*(uint *)(in_RSI + 0x14) < 4) {
    pp_Var1 = (_func_int **)operator_new(0x20);
    *pp_Var1 = (_func_int *)&PTR__MipsElfRelocator_001be160;
    pp_Var1[1] = (_func_int *)0x0;
    pp_Var1[2] = (_func_int *)0x0;
    pp_Var1[3] = (_func_int *)0x0;
  }
  else {
    pp_Var1 = (_func_int **)0x0;
  }
  (this->super_Architecture)._vptr_Architecture = pp_Var1;
  return (__uniq_ptr_data<IElfRelocator,_std::default_delete<IElfRelocator>,_true,_true>)
         (__uniq_ptr_data<IElfRelocator,_std::default_delete<IElfRelocator>,_true,_true>)this;
}

Assistant:

std::unique_ptr<IElfRelocator> CMipsArchitecture::getElfRelocator()
{
	switch (Version)
	{
	case MARCH_PS2:
	case MARCH_PSP:
	case MARCH_N64:
	case MARCH_PSX:
		return std::make_unique<MipsElfRelocator>();
	case MARCH_RSP:
	default:
		return nullptr;
	}
}